

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvim.cpp
# Opt level: O2

void __thiscall nvim::Nvim::async_get_option(Nvim *this,string *name)

{
  allocator local_39;
  string local_38;
  
  std::__cxx11::string::string((string *)&local_38,"nvim_get_option",&local_39);
  NvimRPC::async_call<std::__cxx11::string>(&this->client_,&local_38,name);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void Nvim::async_get_option(const std::string& name) {
    client_.async_call("nvim_get_option", name);
}